

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O3

void __thiscall
test_suite::detail::simple_runner::fail
          (simple_runner *this,char *expr,char *file,int line,char *param_4)

{
  atomic<unsigned_long> *paVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t sVar4;
  char *p0;
  
  LOCK();
  paVar1 = &(this->all_).failed;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->v_).
            super__Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].total;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->v_).
            super__Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].failed;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->all_).total;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  poVar2 = this->log_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  sVar3 = strlen(file);
  do {
    sVar4 = sVar3;
    if (sVar4 == 0) {
      if (file != (char *)0x0) goto LAB_0010530b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00105321;
    }
    sVar3 = sVar4 - 1;
  } while (file[sVar4 - 1] != '/');
  file = file + sVar4;
LAB_0010530b:
  sVar3 = strlen(file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,file,sVar3);
LAB_00105321:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") failed: ",10);
  if (expr == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(expr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,expr,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void
  fail(
      char const* expr,
      char const* file,
      int line,
      char const*) override
  {
    ++all_.failed;
    ++v_.back().total;
    ++v_.back().failed;
    auto const id = ++all_.total;
    log_ <<
         "#" << id <<
         " " << filename(file) <<
         "(" << line << ") "
                        "failed: " << expr << "\n";
  }